

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

SchnorrPubkey * __thiscall
cfd::core::SchnorrPubkey::operator-=
          (SchnorrPubkey *__return_storage_ptr__,SchnorrPubkey *this,ByteData256 *right)

{
  ByteData local_b8;
  ByteData256 local_a0;
  undefined1 local_88 [8];
  SchnorrPubkey key;
  undefined1 local_60 [8];
  Privkey neg;
  Privkey sk;
  ByteData256 *right_local;
  SchnorrPubkey *this_local;
  
  Privkey::Privkey((Privkey *)&neg.is_compressed_,right,kMainnet,true);
  Privkey::CreateNegate((Privkey *)local_60,(Privkey *)&neg.is_compressed_);
  Privkey::GetData(&local_b8,(Privkey *)local_60);
  ByteData256::ByteData256(&local_a0,&local_b8);
  CreateTweakAdd((SchnorrPubkey *)local_88,this,&local_a0,(bool *)0x0);
  ByteData256::~ByteData256((ByteData256 *)0x4b73b0);
  ByteData::~ByteData((ByteData *)0x4b73bc);
  operator=(this,(SchnorrPubkey *)local_88);
  SchnorrPubkey(__return_storage_ptr__,this);
  ~SchnorrPubkey((SchnorrPubkey *)0x4b73ec);
  Privkey::~Privkey((Privkey *)0x4b73f5);
  Privkey::~Privkey((Privkey *)0x4b73fe);
  return __return_storage_ptr__;
}

Assistant:

SchnorrPubkey SchnorrPubkey::operator-=(const ByteData256 &right) {
  Privkey sk(right);
  auto neg = sk.CreateNegate();
  SchnorrPubkey key = CreateTweakAdd(ByteData256(neg.GetData()));
  *this = key;
  return *this;
}